

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Copter.h
# Opt level: O2

void __thiscall
chrono::copter::Copter<6>::Copter
          (Copter<6> *this,ChSystem *sys,ChVector<double> *cpos,
          vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *ppos,
          bool *clockwise,bool are_prop_pos_rel,bool z_up)

{
  shared_ptr<chrono::ChBody> *this_00;
  bool bVar1;
  element_type *peVar2;
  pointer pCVar3;
  element_type *peVar4;
  double dVar5;
  double dVar6;
  element_type *peVar7;
  __shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2> *p_Var8;
  double *pdVar9;
  code *pcVar10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  long lVar11;
  long lVar12;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_02;
  double dVar13;
  shared_ptr<chrono::ChForce> thrust;
  shared_ptr<chrono::ChBody> prop;
  shared_ptr<chrono::ChLinkMotorRotationSpeed> propmot;
  shared_ptr<chrono::ChForce> backtorque;
  shared_ptr<chrono::ChFunction_Const> speed;
  __shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2> local_318;
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> local_308;
  ChQuaternion<double> local_2f8;
  Copter<6> *local_2d0;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *local_2c8;
  ChSystem *local_2c0;
  __shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2> local_2b8;
  ChVector<double> *local_2a8;
  vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  *local_2a0;
  vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  *local_298;
  vector<std::shared_ptr<chrono::ChFunction_Const>,_std::allocator<std::shared_ptr<chrono::ChFunction_Const>_>_>
  *local_290;
  vector<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>,_std::allocator<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>_>
  *local_288;
  vector<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
  *local_280;
  long local_278;
  bool *local_270;
  __shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2> local_268;
  ChQuaternion<double> local_258;
  __shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2> *local_230;
  __shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2> local_228 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_220;
  __shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2> local_218;
  __shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2> local_208;
  __shared_ptr<chrono::ChLinkBase,(__gnu_cxx::_Lock_policy)2> local_1f8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1f0;
  __shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> local_1e8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e0;
  __shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2> local_1d8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d0;
  __shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2> local_1c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1c0;
  __shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2> local_1b8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1b0;
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> local_1a8;
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> local_198;
  element_type *local_188;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_180;
  double local_178;
  double dStack_170;
  double local_168;
  long local_158;
  double local_150;
  double dStack_148;
  ChFrame<double> local_140;
  ChFrame<double> local_b8;
  
  this->_vptr_Copter = (_func_int **)&PTR_GetChassisMeshFilename_abi_cxx11__001a18b0;
  (this->chassis).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->chassis).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->chassis_mesh_path)._M_dataplus._M_p = (pointer)&(this->chassis_mesh_path).field_2;
  (this->chassis_mesh_path)._M_string_length = 0;
  (this->chassis_mesh_path).field_2._M_local_buf[0] = '\0';
  (this->propeller_mesh_path)._M_dataplus._M_p = (pointer)&(this->propeller_mesh_path).field_2;
  (this->propeller_mesh_path)._M_string_length = 0;
  (this->propeller_mesh_path).field_2._M_local_buf[0] = '\0';
  (this->props).
  super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->props).
  super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->props).
  super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->rho = 1.225;
  this->rho0 = 1.225;
  this->pressure = 101325.0;
  this->pressure0 = 101325.0;
  this->Temp0 = 298.0;
  this->Temp = 298.0;
  if (z_up) {
    pdVar9 = (double *)&VECT_Z;
  }
  else {
    pdVar9 = (double *)&VECT_Y;
  }
  (this->backtorques).
  super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->backtorques).
  super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->backtorques).
  super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->motors).
  super__Vector_base<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>,_std::allocator<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->motors).
  super__Vector_base<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>,_std::allocator<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->motors).
  super__Vector_base<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>,_std::allocator<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->speeds).
  super__Vector_base<std::shared_ptr<chrono::ChFunction_Const>,_std::allocator<std::shared_ptr<chrono::ChFunction_Const>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->speeds).
  super__Vector_base<std::shared_ptr<chrono::ChFunction_Const>,_std::allocator<std::shared_ptr<chrono::ChFunction_Const>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->Altitude0 = 0.0;
  this->h0 = 0.0;
  (this->up).m_data[0] = 0.0;
  (this->up).m_data[1] = 0.0;
  (this->up).m_data[2] = 0.0;
  (this->thrusts).
  super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->thrusts).
  super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->thrusts).
  super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->motors).
  super__Vector_base<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>,_std::allocator<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->speeds).
  super__Vector_base<std::shared_ptr<chrono::ChFunction_Const>,_std::allocator<std::shared_ptr<chrono::ChFunction_Const>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->speeds).
  super__Vector_base<std::shared_ptr<chrono::ChFunction_Const>,_std::allocator<std::shared_ptr<chrono::ChFunction_Const>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->speeds).
  super__Vector_base<std::shared_ptr<chrono::ChFunction_Const>,_std::allocator<std::shared_ptr<chrono::ChFunction_Const>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->Cd = 0.0;
  (this->lin_drag).super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->lin_drag).super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->Surf = 0.0;
  if ((ChVector<double> *)pdVar9 != &this->up) {
    pcVar10 = std::__cxx11::string::~string;
    (this->up).m_data[0] = *pdVar9;
    pdVar9 = (double *)chrono::ChLinkLock::IntToDescriptor;
    if (z_up) {
      pcVar10 = __cxa_atexit;
      pdVar9 = (double *)&__libc_single_threaded;
    }
    (this->up).m_data[1] = *(double *)pcVar10;
    (this->up).m_data[2] = *pdVar9;
  }
  local_298 = &this->thrusts;
  local_2a0 = &this->backtorques;
  local_280 = &this->props;
  local_288 = &this->motors;
  local_290 = &this->speeds;
  local_2c8 = ppos;
  local_2c0 = sys;
  local_270 = clockwise;
  chrono_types::make_shared<chrono::ChBody,_0>();
  this_00 = &this->chassis;
  std::__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_00->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> *)&local_2f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2f8.m_data + 1));
  peVar2 = (this_00->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar2 + 0x80 != (element_type *)cpos) {
    *(double *)(peVar2 + 0x80) = cpos->m_data[0];
    *(double *)(peVar2 + 0x88) = cpos->m_data[1];
    *(double *)(peVar2 + 0x90) = cpos->m_data[2];
  }
  chrono::ChVariablesBodyOwnMass::SetBodyMass(10.0);
  local_2f8.m_data[0] = (double)&DAT_3ff0000000000000;
  local_2f8.m_data[1] = (double)&DAT_3ff0000000000000;
  local_2f8.m_data[2] = 1.0;
  chrono::ChBody::SetInertiaXX
            ((this_00->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  chrono::ChBody::SetBodyFixed
            (SUB81((this_00->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                   0));
  local_2a8 = cpos;
  std::__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_198,&this_00->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*(long *)local_2c0 + 0x128))(local_2c0,&local_198);
  local_230 = &(this->lin_drag).super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_198._M_refcount);
  dVar13 = ChVector<double>::Dot
                     ((ChVector<double> *)
                      ((this->chassis).
                       super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x80)
                      ,&this->up);
  this->h0 = dVar13;
  lVar12 = 0;
  lVar11 = 0;
  local_188 = (element_type *)0x3fc999999999999a;
  p_Stack_180 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fc999999999999a;
  local_2d0 = this;
  do {
    if (lVar12 == 0x90) {
      std::make_shared<chrono::ChForce>();
      p_Var8 = local_230;
      std::__shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>::operator=
                (local_230,(__shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2> *)&local_2f8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2f8.m_data + 1));
      peVar4 = p_Var8->_M_ptr;
      *(element_type **)(peVar4 + 0x38) =
           (this_00->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      *(undefined4 *)(peVar4 + 0x40) = 0;
      chrono::ChForce::SetMforce(0.0);
      return;
    }
    chrono_types::make_shared<chrono::ChBody,_0>();
    std::vector<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
    ::push_back(local_280,(value_type *)&local_308);
    pCVar3 = (local_2c8->
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (are_prop_pos_rel) {
      dVar5 = local_2a8->m_data[1];
      pdVar9 = (double *)((long)pCVar3->m_data + lVar12);
      dVar6 = pdVar9[1];
      dVar13 = local_2a8->m_data[2] + *(double *)((long)pCVar3->m_data + lVar12 + 0x10);
      *(double *)(local_308._M_ptr + 0x80) = local_2a8->m_data[0] + *pdVar9;
      *(double *)(local_308._M_ptr + 0x88) = dVar5 + dVar6;
LAB_001829e2:
      *(double *)(local_308._M_ptr + 0x90) = dVar13;
    }
    else if ((element_type *)((long)pCVar3->m_data + lVar12) != local_308._M_ptr + 0x80) {
      *(undefined8 *)(local_308._M_ptr + 0x80) = *(undefined8 *)((long)pCVar3->m_data + lVar12);
      *(undefined8 *)(local_308._M_ptr + 0x88) = *(undefined8 *)((long)pCVar3->m_data + lVar12 + 8);
      dVar13 = *(double *)((long)pCVar3->m_data + lVar12 + 0x10);
      goto LAB_001829e2;
    }
    chrono::ChVariablesBodyOwnMass::SetBodyMass(1.0);
    local_2f8.m_data[0] = (double)local_188;
    local_2f8.m_data[1] = (double)p_Stack_180;
    local_2f8.m_data[2] = 0.2;
    chrono::ChBody::SetInertiaXX(local_308._M_ptr);
    chrono::ChBody::SetBodyFixed(SUB81(local_308._M_ptr,0));
    std::__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1a8,&local_308);
    (**(code **)(*(long *)local_2c0 + 0x128))(local_2c0,&local_1a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a8._M_refcount);
    std::make_shared<chrono::ChLinkMotorRotationSpeed>();
    local_2f8.m_data[0] = (double)Q_ROTATE_Y_TO_Z;
    local_2f8.m_data[1] = (double)_operator<<;
    local_2f8.m_data[2] = _memset;
    local_2f8.m_data[3] = _ConstraintsBiLoad_Qc;
    if (z_up) {
      local_2f8.m_data[0] = (double)QUNIT;
      local_2f8.m_data[1] = (double)_ChLinkMotorRotationSpeed;
      local_2f8.m_data[2] = _ChBody;
      local_2f8.m_data[3] = _ComputeMassProperties;
    }
    if (local_270[lVar11] == true) {
      ChQuaternion<double>::operator*
                (&local_258,(ChQuaternion<double> *)&Q_FLIP_AROUND_X,&local_2f8);
      local_2f8.m_data[0] = local_258.m_data[0];
      local_2f8.m_data[1] = local_258.m_data[1];
      local_2f8.m_data[2] = local_258.m_data[2];
      local_2f8.m_data[3] = local_258.m_data[3];
    }
    peVar7 = local_2b8._M_ptr;
    local_278 = lVar11;
    if (are_prop_pos_rel) {
      std::__shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<chrono::ChBody,void>(local_228,&local_308);
      std::__shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<chrono::ChBody,void>
                (local_1b8,&this_00->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)
      ;
      pCVar3 = (local_2c8->
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pdVar9 = (double *)((long)pCVar3->m_data + lVar12);
      local_258.m_data[0] = local_2a8->m_data[0] + *pdVar9;
      local_258.m_data[1] = local_2a8->m_data[1] + pdVar9[1];
      local_258.m_data[2] = local_2a8->m_data[2] + *(double *)((long)pCVar3->m_data + lVar12 + 0x10)
      ;
      ChFrame<double>::ChFrame(&local_b8,(ChVector<double> *)&local_258,&local_2f8);
      (**(code **)(*(long *)peVar7 + 0x240))(peVar7,local_228,local_1b8,&local_b8);
      this_01 = &local_1b0;
      this_02 = &local_220;
      this = local_2d0;
    }
    else {
      std::__shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<chrono::ChBody,void>(local_1c8,&local_308);
      std::__shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<chrono::ChBody,void>
                (local_1d8,&this_00->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)
      ;
      ChFrame<double>::ChFrame
                (&local_140,
                 (ChVector<double> *)
                 ((long)((local_2c8->
                         super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12),&local_2f8);
      (**(code **)(*(long *)peVar7 + 0x240))(peVar7,local_1c8,local_1d8,&local_140);
      this_01 = &local_1d0;
      this_02 = &local_1c0;
    }
    lVar11 = local_278;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_01);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_02);
    local_318._M_ptr._0_4_ = 0;
    std::make_shared<chrono::ChFunction_Const,int>((int *)&local_258);
    peVar7 = local_2b8._M_ptr;
    std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::ChFunction_Const,void>
              (local_1e8,
               (__shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2> *)&local_258);
    ChLinkMotorRotationSpeed::SetSpeedFunction(peVar7,(shared_ptr<chrono::ChFunction> *)local_1e8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e0);
    std::__shared_ptr<chrono::ChLinkBase,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::ChLinkMotorRotationSpeed,void>(local_1f8,&local_2b8);
    (**(code **)(*(long *)local_2c0 + 0x138))(local_2c0,local_1f8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1f0);
    std::
    vector<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>,_std::allocator<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>_>
    ::push_back(local_288,(value_type *)&local_2b8);
    std::
    vector<std::shared_ptr<chrono::ChFunction_Const>,_std::allocator<std::shared_ptr<chrono::ChFunction_Const>_>_>
    ::push_back(local_290,(value_type *)&local_258);
    this->u_p[lVar11] = 0.0;
    std::make_shared<chrono::ChForce>();
    peVar2 = local_308._M_ptr;
    *(element_type **)(CONCAT44(local_318._M_ptr._4_4_,local_318._M_ptr._0_4_) + 0x38) =
         local_308._M_ptr;
    std::__shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_208,&local_318);
    chrono::ChBody::AddForce(peVar2,&local_208);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_208._M_refcount);
    *(undefined4 *)(CONCAT44(local_318._M_ptr._4_4_,local_318._M_ptr._0_4_) + 0x40) = 0;
    chrono::ChForce::SetMforce(0.0);
    local_178 = (this->up).m_data[0];
    dStack_170 = (this->up).m_data[1];
    local_168 = (this->up).m_data[2];
    chrono::ChForce::SetRelDir(CONCAT44(local_318._M_ptr._4_4_,local_318._M_ptr._0_4_),&local_178);
    std::
    vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>::
    push_back(local_298,(value_type *)&local_318);
    std::make_shared<chrono::ChForce>();
    peVar2 = local_308._M_ptr;
    *(element_type **)(local_268._M_ptr + 0x38) = local_308._M_ptr;
    std::__shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_218,&local_268);
    chrono::ChBody::AddForce(peVar2,&local_218);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_218._M_refcount);
    *(undefined4 *)(local_268._M_ptr + 0x40) = 1;
    chrono::ChForce::SetMforce(0.0);
    local_150 = (this->up).m_data[1];
    dStack_148 = (this->up).m_data[2];
    bVar1 = local_270[lVar11];
    if (bVar1 == false) {
      local_150 = -local_150;
      dStack_148 = -dStack_148;
    }
    dVar13 = (this->up).m_data[0];
    local_158 = (ulong)(bVar1 & 1) * (long)dVar13 + (ulong)!(bool)(bVar1 & 1) * (long)-dVar13;
    chrono::ChForce::SetRelDir(local_268._M_ptr,&local_158);
    std::
    vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>::
    push_back(local_2a0,(value_type *)&local_268);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_268._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_318._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_258.m_data + 1));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2b8._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_308._M_refcount);
    lVar11 = lVar11 + 1;
    lVar12 = lVar12 + 0x18;
  } while( true );
}

Assistant:

Copter<nop>::Copter(ChSystem& sys,
                    const ChVector<>& cpos,
                    std::vector<ChVector<>> ppos,
                    const bool clockwise[],
                    bool are_prop_pos_rel,
                    bool z_up) {
    // TODO: ChBodyAuxRef here might be more convenient
    up = (z_up) ? VECT_Z : VECT_Y;
    chassis = chrono_types::make_shared<ChBody>();
    chassis->SetPos(cpos);
    // placeholder Data.
    chassis->SetMass(10);
    chassis->SetInertiaXX(ChVector<>(1, 1, 1));
    chassis->SetBodyFixed(false);
    sys.AddBody(chassis);
    h0 = chassis->GetPos() ^ up;
    // 26.4 inch propellers
    for (int p = 0; p < nop; p++) {
        auto prop = chrono_types::make_shared<ChBody>();
        props.push_back(prop);
        if (are_prop_pos_rel) {
            prop->SetPos(cpos + ppos[p]);
        } else {
            prop->SetPos(ppos[p]);
        }
        // Data from little hexy, page 132.
        prop->SetMass(1);
        prop->SetInertiaXX(ChVector<>(0.2, 0.2, 0.2));
        prop->SetBodyFixed(false);
        sys.AddBody(prop);

        auto propmot = chrono_types::make_shared<ChLinkMotorRotationSpeed>();
        ChQuaternion<> motor_rot = Q_ROTATE_Y_TO_Z;
        if (z_up) {
            motor_rot = QUNIT;
        };
        if (clockwise[p]) {
            motor_rot = Q_FLIP_AROUND_X * motor_rot;
        };
        
        if (are_prop_pos_rel) {
            propmot->Initialize(prop, chassis, ChFrame<>(cpos + ppos[p], motor_rot)); 
        } else {
            propmot->Initialize(prop, chassis, ChFrame<>(ppos[p], motor_rot));
        }
        auto speed = chrono_types::make_shared<ChFunction_Const>(0);
        propmot->SetSpeedFunction(speed);
        sys.AddLink(propmot);

        motors.push_back(propmot);
        speeds.push_back(speed);

        u_p[p] = 0;
        auto thrust = chrono_types::make_shared<ChForce>();
        thrust->SetBody(prop.get());
        prop->AddForce(thrust);
        thrust->SetMode(ChForce::FORCE);
        thrust->SetMforce(0);
        thrust->SetRelDir(up);
        thrusts.push_back(thrust);

        auto backtorque = std::make_shared<ChForce>();
        backtorque->SetBody(prop.get());
        prop->AddForce(backtorque);
        backtorque->SetMode(ChForce::TORQUE);
        backtorque->SetMforce(0);
        // Resistance Torque direction opposed to omega
        ChVector<> tdir = (clockwise[p]) ? up : -up;
        backtorque->SetRelDir(tdir);
        backtorques.push_back(backtorque);
    }

    // linear drag on copter body
    lin_drag = std::make_shared<ChForce>();
    lin_drag->SetBody(chassis.get());
    lin_drag->SetMode(ChForce::FORCE);
    lin_drag->SetMforce(0);
}